

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O0

int __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadTorus>::ClassId(TPZGeoElRefLess<pzgeom::TPZQuadTorus> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  TPZQuadTorus *in_stack_fffffffffffffe20;
  allocator<char> *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  TPZQuadTorus *in_stack_fffffffffffffe50;
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  uVar1 = Hash((string *)in_stack_fffffffffffffe20);
  iVar2 = TPZGeoEl::ClassId((TPZGeoEl *)0x1712a46);
  pzgeom::TPZQuadTorus::TPZQuadTorus(in_stack_fffffffffffffe20);
  iVar3 = pzgeom::TPZQuadTorus::ClassId(in_stack_fffffffffffffe50);
  pzgeom::TPZQuadTorus::~TPZQuadTorus((TPZQuadTorus *)0x1712a93);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return uVar1 ^ iVar2 * 2 ^ iVar3 << 2;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}